

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
MlmWrap::getClients_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,MlmWrap *this)

{
  char *__ptr;
  zmsg_t *msg;
  allocator local_49;
  zmsg_t *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_48 = czhelp_zmsg_create("s","CLI",0);
  std::mutex::lock(&this->actormutex);
  zactor_send(this->actor,&local_48);
  local_48 = zactor_recv(this->actor);
  pthread_mutex_unlock((pthread_mutex_t *)&this->actormutex);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __ptr = zmsg_popstr(local_48);
  while (__ptr != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_40,__ptr,&local_49);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    free(__ptr);
    __ptr = zmsg_popstr(local_48);
  }
  zmsg_destroy(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> MlmWrap::getClients(){
    zmsg_t *msg = czhelp_zmsg_create("s", getclients, NULL);
    {
        std::lock_guard<std::mutex> lock(actormutex);
        zactor_send(actor, &msg);
        msg = zactor_recv(actor);
    }
    std::vector<std::string> clients;
    char *cl = zmsg_popstr(msg);
    while(cl){
        clients.push_back(cl);
        freen(cl);
        cl = zmsg_popstr(msg);
    }
    zmsg_destroy(&msg);
    return clients;
}